

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_write_all_coc
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  opj_tccp_t *poVar1;
  OPJ_UINT32 OVar2;
  opj_tccp_t *l_tccp0;
  OPJ_BYTE *pOVar3;
  OPJ_SIZE_T OVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  opj_tccp_t *in_R9;
  long lVar8;
  OPJ_UINT32 p_comp_no;
  ulong uVar9;
  uint p_nb_bytes;
  int local_6c;
  opj_stream_private *local_68;
  opj_event_mgr *local_60;
  ulong local_58;
  opj_tcp_t *local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  local_68 = p_stream;
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x14dd,
                  "OPJ_BOOL opj_j2k_write_all_coc(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager == (opj_event_mgr *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x14de,
                  "OPJ_BOOL opj_j2k_write_all_coc(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_stream == (opj_stream_private *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x14df,
                  "OPJ_BOOL opj_j2k_write_all_coc(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  uVar6 = p_j2k->m_private_image->numcomps;
  uVar5 = (ulong)uVar6;
  if (1 < uVar6) {
    uVar9 = 1;
    lVar8 = 0x7e8;
    local_60 = p_manager;
    do {
      poVar1 = (p_j2k->m_cp).tcps[p_j2k->m_current_tile_number].tccps;
      local_38 = uVar9 * 0x438;
      if (poVar1->csty == poVar1[uVar9].csty) {
        in_R9 = poVar1 + uVar9;
        uVar6 = poVar1->numresolutions;
        if (((((uVar6 != in_R9->numresolutions) || (poVar1->cblkw != in_R9->cblkw)) ||
             (poVar1->cblkh != in_R9->cblkh)) ||
            ((poVar1->cblksty != in_R9->cblksty || (poVar1->qmfbid != in_R9->qmfbid)))) ||
           (((poVar1[uVar9].csty ^ poVar1->csty) & 1) != 0)) goto LAB_0011aaf4;
        if ((ulong)uVar6 != 0) {
          uVar7 = 0;
          do {
            in_R9 = (opj_tccp_t *)(ulong)poVar1->prcw[uVar7];
            if ((poVar1->prcw[uVar7] != *(uint *)((long)poVar1 + uVar7 * 4 + lVar8 + -0x84)) ||
               (in_R9 = (opj_tccp_t *)(ulong)poVar1->prch[uVar7],
               poVar1->prch[uVar7] != *(uint *)((long)poVar1->stepsizes + uVar7 * 4 + lVar8 + -0x1c)
               )) goto LAB_0011aaf4;
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
      }
      else {
LAB_0011aaf4:
        p_comp_no = (OPJ_UINT32)uVar9;
        OVar2 = opj_j2k_get_SPCod_SPCoc_size(p_j2k,p_j2k->m_current_tile_number,p_comp_no);
        uVar6 = OVar2 + (7 - (uint)((uint)uVar5 < 0x101));
        local_40 = (ulong)uVar6;
        if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar6) {
          pOVar3 = (OPJ_BYTE *)
                   opj_realloc((p_j2k->m_specific_param).m_encoder.m_header_tile_data,local_40);
          if (pOVar3 == (OPJ_BYTE *)0x0) {
            opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
            (p_j2k->m_specific_param).m_decoder.m_last_sot_read_pos = 0;
            (p_j2k->m_specific_param).m_decoder.m_last_tile_part = 0;
            opj_event_msg(p_manager,1,"Not enough memory to write COC marker\n");
            return 0;
          }
          (p_j2k->m_specific_param).m_encoder.m_header_tile_data = pOVar3;
          (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar6;
        }
        pOVar3 = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
        local_50 = (p_j2k->m_cp).tcps;
        local_58 = (ulong)p_j2k->m_current_tile_number;
        uVar6 = (uint)(p_j2k->m_private_image->numcomps < 0x101);
        p_nb_bytes = 2 - uVar6;
        uVar6 = uVar6 ^ 7;
        local_48 = lVar8;
        OVar2 = opj_j2k_get_SPCod_SPCoc_size(p_j2k,p_j2k->m_current_tile_number,p_comp_no);
        local_6c = uVar6 + OVar2;
        opj_write_bytes_LE(pOVar3,0xff53,2);
        opj_write_bytes_LE(pOVar3 + 2,(uVar6 + OVar2) - 2,2);
        opj_write_bytes_LE(pOVar3 + 4,p_comp_no,p_nb_bytes);
        opj_write_bytes_LE(pOVar3 + (ulong)p_nb_bytes + 4,
                           *(OPJ_UINT32 *)
                            ((long)(local_50[local_58].tccps)->stepsizes + local_38 + -0x1c),1);
        lVar8 = local_48;
        p_manager = local_60;
        local_6c = local_6c - uVar6;
        opj_j2k_write_SPCod_SPCoc
                  (p_j2k,p_j2k->m_current_tile_number,p_nb_bytes + (int)pOVar3 + 5,
                   (OPJ_BYTE *)&local_6c,(OPJ_UINT32 *)local_60,(opj_event_mgr *)in_R9);
        uVar5 = local_40;
        OVar4 = opj_stream_write_data
                          (local_68,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,local_40,
                           p_manager);
        if (OVar4 != uVar5) {
          return 0;
        }
      }
      uVar9 = uVar9 + 1;
      uVar5 = (ulong)p_j2k->m_private_image->numcomps;
      lVar8 = lVar8 + 0x438;
    } while (uVar9 < uVar5);
  }
  return 1;
}

Assistant:

static OPJ_BOOL opj_j2k_write_all_coc(
    opj_j2k_t *p_j2k,
    struct opj_stream_private *p_stream,
    struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 compno;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    for (compno = 1; compno < p_j2k->m_private_image->numcomps; ++compno) {
        /* cod is first component of first tile */
        if (! opj_j2k_compare_coc(p_j2k, 0, compno)) {
            if (! opj_j2k_write_coc(p_j2k, compno, p_stream, p_manager)) {
                return OPJ_FALSE;
            }
        }
    }

    return OPJ_TRUE;
}